

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseModule
          (WastParser *this,unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *out_module
          )

{
  _Head_base<0UL,_wabt::Command_*,_false> _Var1;
  bool bVar2;
  Result RVar3;
  TokenType TVar4;
  TokenType TVar5;
  tuple<wabt::Module_*,_std::default_delete<wabt::Module>_> module_00;
  Enum EVar6;
  long *plVar7;
  TokenTypePair pair;
  long lVar8;
  pointer __p;
  __single_object module;
  __uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_> local_90;
  _Head_base<0UL,_wabt::Command_*,_false> local_88 [2];
  Command local_78;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
  super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>)operator_new(0x370);
  memset((void *)module_00.
                 super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                 super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl,0,0x360);
  (((string *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x20))->_M_dataplus)._M_p =
       (pointer)((long)module_00.
                       super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                       super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x30);
  ((ModuleFieldList *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x40))->first_ =
       (ModuleField *)0x0;
  *(ModuleField **)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x48) = (ModuleField *)0x0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined8 *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined8 *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x5c) = 0;
  *(undefined8 *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 100) = 0;
  memset((vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_> *)
         ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>
                .super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x70),0,0x108);
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x178))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1a8);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x180) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x188))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 400) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x198))->_M_max_load_factor =
       1.0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1a0) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1a8) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1b0))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1e0);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1b8) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1c0))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1c8) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1d0))->_M_max_load_factor =
       1.0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1d8) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1e0) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1e8))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x218);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1f0) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x1f8))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x200) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x208))->_M_max_load_factor =
       1.0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x210) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x218) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x220))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x250);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x228) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x230))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x238) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x240))->_M_max_load_factor =
       1.0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x248) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x250) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 600))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x288);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x260) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x268))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x270) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x278))->_M_max_load_factor =
       1.0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x280) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x288) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x290))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2c0);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x298) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2a0))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2a8) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2b0))->_M_max_load_factor =
       1.0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2b8) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2c0) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2c8))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2f8);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2d0) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2d8))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2e0) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2e8))->_M_max_load_factor =
       1.0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2f0) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x2f8) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x300))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x330);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x308) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x310))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x318) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 800))->_M_max_load_factor = 1.0
  ;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x328) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x330) = (__node_base_ptr)0x0;
  (((BindingHash *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x338))->
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  )._M_h._M_buckets =
       (__node_base_ptr *)
       ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
              super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x368);
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x340) = 1;
  ((__node_base *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x348))->_M_nxt =
       (_Hash_node_base *)0x0;
  *(size_type *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x350) = 0;
  ((_Prime_rehash_policy *)
  ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x358))->_M_max_load_factor =
       1.0;
  *(size_t *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x360) = 0;
  *(__node_base_ptr *)
   ((long)module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
          super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl + 0x368) = (__node_base_ptr)0x0;
  local_90._M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
  super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
       (tuple<wabt::Module_*,_std::default_delete<wabt::Module>_>)
       (tuple<wabt::Module_*,_std::default_delete<wabt::Module>_>)
       module_00.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
       super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl;
  bVar2 = PeekMatchLpar(this,Module);
  if (bVar2) {
    local_88[0]._M_head_impl = (Command *)0x0;
    RVar3 = ParseModuleCommand(this,(Script *)0x0,(CommandPtr *)local_88);
    _Var1._M_head_impl = local_88[0]._M_head_impl;
    if (RVar3.enum_ == Error) {
      if (local_88[0]._M_head_impl != (Command *)0x0) {
        (*(local_88[0]._M_head_impl)->_vptr_Command[1])(local_88[0]._M_head_impl);
      }
      EVar6 = Error;
      goto LAB_0013629d;
    }
    if (((local_88[0]._M_head_impl)->type != ScriptModule) &&
       ((local_88[0]._M_head_impl)->type != First)) {
      __assert_fail("isa<ScriptModuleCommand>(command.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                    ,0x48d,"Result wabt::WastParser::ParseModule(std::unique_ptr<Module> *)");
    }
    Module::operator=((Module *)
                      module_00.
                      super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                      super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl,
                      (Module *)(local_88[0]._M_head_impl + 1));
    (*(_Var1._M_head_impl)->_vptr_Command[1])(_Var1._M_head_impl);
  }
  else {
    TVar4 = Peek(this,0);
    TVar5 = Peek(this,1);
    pair._M_elems[1] = TVar5;
    pair._M_elems[0] = TVar4;
    bVar2 = anon_unknown_1::IsModuleField(pair);
    if (bVar2) {
      RVar3 = ParseModuleFieldList
                        (this,(Module *)
                              module_00.
                              super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>
                              .super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl);
      EVar6 = Error;
      if (RVar3.enum_ == Error) goto LAB_0013629d;
    }
    else {
      Match(this,Lpar);
      local_88[0]._M_head_impl = &local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"a module field","");
      plVar7 = local_58;
      local_68[0] = plVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"a module","");
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 (string *)local_88,&local_48);
      ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_48,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      lVar8 = -0x40;
      do {
        if (plVar7 != (long *)plVar7[-2]) {
          operator_delete((long *)plVar7[-2],*plVar7 + 1);
        }
        plVar7 = plVar7 + -4;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0);
    }
  }
  RVar3 = Expect(this,Eof);
  EVar6 = Error;
  if ((RVar3.enum_ != Error) &&
     ((this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_start)) {
    local_90._M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
    super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
         (tuple<wabt::Module_*,_std::default_delete<wabt::Module>_>)
         (_Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>)0x0;
    std::__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>::reset
              ((__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_> *)out_module,
               (pointer)module_00.
                        super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                        super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl);
    EVar6 = Ok;
  }
LAB_0013629d:
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr
            ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)&local_90);
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseModule(std::unique_ptr<Module>* out_module) {
  WABT_TRACE(ParseModule);
  auto module = std::make_unique<Module>();

  if (PeekMatchLpar(TokenType::Module)) {
    // Starts with "(module". Allow text and binary modules, but no quoted
    // modules.
    CommandPtr command;
    CHECK_RESULT(ParseModuleCommand(nullptr, &command));
    if (isa<ModuleCommand>(command.get())) {
      auto module_command = cast<ModuleCommand>(std::move(command));
      *module = std::move(module_command->module);
    } else {
      assert(isa<ScriptModuleCommand>(command.get()));
      auto module_command = cast<ScriptModuleCommand>(std::move(command));
      *module = std::move(module_command->module);
    }
  } else if (IsModuleField(PeekPair())) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    CHECK_RESULT(ParseModuleFieldList(module.get()));
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a module"});
  }

  EXPECT(Eof);
  if (errors_->size() == 0) {
    *out_module = std::move(module);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}